

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O0

char __thiscall json11::anon_unknown_21::JsonParser::get_next_token(JsonParser *this)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  allocator local_39;
  string local_38;
  JsonParser *local_18;
  JsonParser *this_local;
  
  local_18 = this;
  consume_garbage(this);
  if ((this->failed & 1U) == 0) {
    sVar1 = this->i;
    sVar2 = std::__cxx11::string::size();
    if (sVar1 == sVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_38,"unexpected end of input",&local_39);
      this_local._7_1_ = fail<char>(this,&local_38,'\0');
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
    else {
      this->i = this->i + 1;
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this->str);
      this_local._7_1_ = *pcVar3;
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

char get_next_token() {
        consume_garbage();
        if (failed) return static_cast<char>(0);
        if (i == str.size())
            return fail("unexpected end of input", static_cast<char>(0));

        return str[i++];
    }